

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamIndexFactory_p.cpp
# Opt level: O1

string * BamTools::Internal::BamIndexFactory::FindIndexFilename
                   (string *__return_storage_ptr__,string *bamFilename,IndexType *preferredType)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  string local_68;
  IndexType local_44;
  string local_40;
  
  if (bamFilename->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  CreateIndexFilename(&local_68,bamFilename,preferredType);
  psVar2 = &local_68._M_string_length;
  if (local_68._M_string_length == 0) {
    if (*preferredType != STANDARD) {
      local_44 = STANDARD;
      CreateIndexFilename(&local_40,bamFilename,&local_44);
      std::__cxx11::string::_M_assign((string *)&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      if (local_68._M_string_length != 0) goto LAB_001978d5;
    }
    if (*preferredType != BAMTOOLS) {
      local_44 = BAMTOOLS;
      CreateIndexFilename(&local_40,bamFilename,&local_44);
      std::__cxx11::string::_M_assign((string *)&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      if (local_68._M_string_length != 0) goto LAB_001978d5;
    }
    paVar1 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    psVar2 = &__return_storage_ptr__->_M_string_length;
  }
  else {
LAB_001978d5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    paVar1 = &local_68.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_68.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_68.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_68._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_68.field_2._M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = local_68._M_string_length;
    local_68._M_dataplus._M_p = (pointer)paVar1;
  }
  *psVar2 = 0;
  paVar1->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string BamIndexFactory::FindIndexFilename(const std::string& bamFilename,
                                                     const BamIndex::IndexType& preferredType)
{
    // skip if BAM filename provided is empty
    if (bamFilename.empty()) return std::string();

    // try to find index of preferred type first
    // return index filename if found
    std::string indexFilename = CreateIndexFilename(bamFilename, preferredType);
    if (!indexFilename.empty()) return indexFilename;

    // couldn't find preferred type, try the other supported types
    // return index filename if found
    if (preferredType != BamIndex::STANDARD) {
        indexFilename = CreateIndexFilename(bamFilename, BamIndex::STANDARD);
        if (!indexFilename.empty()) return indexFilename;
    }
    if (preferredType != BamIndex::BAMTOOLS) {
        indexFilename = CreateIndexFilename(bamFilename, BamIndex::BAMTOOLS);
        if (!indexFilename.empty()) return indexFilename;
    }

    // otherwise couldn't find any index matching this filename
    return std::string();
}